

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O1

adt_u32List_t * adt_u32List_new(void)

{
  adt_u32List_t *paVar1;
  int *piVar2;
  
  paVar1 = (adt_u32List_t *)malloc(0x10);
  if (paVar1 == (adt_u32List_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xc;
  }
  else {
    paVar1->pFirst = (adt_u32List_elem_t *)0x0;
    paVar1->pLast = (adt_u32List_elem_t *)0x0;
  }
  return paVar1;
}

Assistant:

adt_u32List_t* adt_u32List_new(void)
{
   adt_u32List_t *self = (adt_u32List_t*) malloc(sizeof(adt_u32List_t));
   if (self != 0)
   {
      adt_u32List_create(self);
   }
   else
   {
      errno = ENOMEM;
   }
   return self;
}